

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u8 minMaxQuery(sqlite3 *db,Expr *pFunc,ExprList **ppMinMax)

{
  byte bVar1;
  ExprList *pEVar2;
  long lVar3;
  u8 uVar4;
  u8 uVar5;
  
  pEVar2 = (pFunc->x).pList;
  if ((pEVar2 == (ExprList *)0x0) || (pEVar2->nExpr != 1)) {
    return '\0';
  }
  lVar3 = 0;
  do {
    bVar1 = (pFunc->u).zToken[lVar3];
    if (bVar1 == "min"[lVar3]) {
      if ((ulong)bVar1 == 0) goto LAB_001a5e73;
    }
    else if (""[bVar1] != ""[(byte)"min"[lVar3]]) {
      lVar3 = 0;
      break;
    }
    lVar3 = lVar3 + 1;
  } while( true );
LAB_001a5e84:
  bVar1 = (pFunc->u).zToken[lVar3];
  if (bVar1 == "max"[lVar3]) {
    if ((ulong)bVar1 == 0) goto LAB_001a5eb2;
  }
  else if (""[bVar1] != ""[(byte)"max"[lVar3]]) {
    return '\0';
  }
  lVar3 = lVar3 + 1;
  goto LAB_001a5e84;
LAB_001a5eb2:
  uVar5 = '\x01';
  uVar4 = '\x02';
  goto LAB_001a5eb8;
LAB_001a5e73:
  uVar4 = '\x01';
  uVar5 = '\0';
LAB_001a5eb8:
  pEVar2 = sqlite3ExprListDup(db,pEVar2,0);
  *ppMinMax = pEVar2;
  if (pEVar2 != (ExprList *)0x0) {
    pEVar2->a[0].sortOrder = uVar5;
  }
  return uVar4;
}

Assistant:

static u8 minMaxQuery(sqlite3 *db, Expr *pFunc, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;      /* Return value */
  ExprList *pEList = pFunc->x.pList;    /* Arguments to agg function */
  const char *zFunc;                    /* Name of aggregate function pFunc */
  ExprList *pOrderBy;
  u8 sortOrder;

  assert( *ppMinMax==0 );
  assert( pFunc->op==TK_AGG_FUNCTION );
  if( pEList==0 || pEList->nExpr!=1 ) return eRet;
  zFunc = pFunc->u.zToken;
  if( sqlite3StrICmp(zFunc, "min")==0 ){
    eRet = WHERE_ORDERBY_MIN;
    sortOrder = SQLITE_SO_ASC;
  }else if( sqlite3StrICmp(zFunc, "max")==0 ){
    eRet = WHERE_ORDERBY_MAX;
    sortOrder = SQLITE_SO_DESC;
  }else{
    return eRet;
  }
  *ppMinMax = pOrderBy = sqlite3ExprListDup(db, pEList, 0);
  assert( pOrderBy!=0 || db->mallocFailed );
  if( pOrderBy ) pOrderBy->a[0].sortOrder = sortOrder;
  return eRet;
}